

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

string * anon_unknown.dwarf_1f82d4::make_include_path
                   (string *__return_storage_ptr__,string *base_path,string *dest_path)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  size_t last_slash_pos;
  string *dest_path_local;
  string *base_path_local;
  
  last_slash_pos = (size_t)dest_path;
  dest_path_local = base_path;
  base_path_local = __return_storage_ptr__;
  lVar1 = std::__cxx11::string::find_last_of((char)base_path,0x2f);
  local_28 = lVar1;
  lVar2 = std::__cxx11::string::length();
  if (lVar1 == lVar2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)last_slash_pos);
  }
  else {
    lVar1 = std::__cxx11::string::length();
    if ((lVar1 != 0) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[](last_slash_pos), *pcVar3 == '/')) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)last_slash_pos);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)&local_48,(ulong)dest_path_local);
    std::operator+(__return_storage_ptr__,&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   last_slash_pos);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string make_include_path(const std::string& base_path, const std::string& dest_path)
{
    size_t last_slash_pos = base_path.find_last_of('/');

    if (last_slash_pos == base_path.length())
    {
        return dest_path;
    }

    if (dest_path.length() >= 1 && dest_path[0] == '/')
    {
        return dest_path;
    }

    return base_path.substr(0, last_slash_pos + 1) + dest_path;
}